

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O0

void __thiscall slang::DiagnosticEngine::setDefaultWarnings(DiagnosticEngine *this)

{
  DiagnosticEngine *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> name;
  DiagnosticSeverity in_stack_00000014;
  DiagGroup *in_stack_00000018;
  size_t in_stack_ffffffffffffffd8;
  
  setIgnoreAllWarnings(in_RDI,true);
  name = sv((char *)in_RDI,in_stack_ffffffffffffffd8);
  findDiagGroup(in_RDI,name);
  setSeverity(this,in_stack_00000018,in_stack_00000014);
  return;
}

Assistant:

void DiagnosticEngine::setDefaultWarnings() {
    setIgnoreAllWarnings(true);
    setSeverity(*findDiagGroup("default"sv), DiagnosticSeverity::Warning);
}